

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest_tests.cpp
# Opt level: O2

void __thiscall rest_tests::test_query_string::test_method(test_query_string *this)

{
  long lVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  string *psVar3;
  RESTResponseFormat *pRVar4;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  undefined4 local_e4;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  RESTResponseFormat rf;
  undefined1 local_78 [32];
  string param;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  param._M_dataplus._M_p = (pointer)&param.field_2;
  param._M_string_length = 0;
  param.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"/rest/endpoint/someresource.json",(allocator<char> *)&local_e4);
  rf = ParseDataFormat(&param,(string *)local_78);
  std::__cxx11::string::~string((string *)local_78);
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rest_tests.cpp"
  ;
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x14;
  file.m_begin = (iterator)&local_90;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_a0,msg);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rest_tests.cpp"
  ;
  local_a8 = "";
  pvVar2 = (iterator)0x2;
  psVar3 = &param;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[28]>
            (local_78,&local_b0,0x14,1,2,psVar3,"param","/rest/endpoint/someresource",
             "\"/rest/endpoint/someresource\"");
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rest_tests.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)psVar3;
  msg_00.m_begin = pvVar2;
  file_00.m_end = (iterator)0x15;
  file_00.m_begin = (iterator)&local_c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_d0,msg_00
            );
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rest_tests.cpp"
  ;
  local_d8 = "";
  local_e4 = 3;
  pvVar2 = (iterator)0x2;
  pRVar4 = &rf;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,RESTResponseFormat,RESTResponseFormat>
            (local_78,&local_e0,0x15,1,2,pRVar4,"rf",(allocator<char> *)&local_e4,
             "RESTResponseFormat::JSON");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"/rest/endpoint/someresource.bin?p1=v1",(allocator<char> *)&local_e4
            );
  rf = ParseDataFormat(&param,(string *)local_78);
  std::__cxx11::string::~string((string *)local_78);
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rest_tests.cpp"
  ;
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)pRVar4;
  msg_01.m_begin = pvVar2;
  file_01.m_end = (iterator)0x19;
  file_01.m_begin = (iterator)&local_f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_108,
             msg_01);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rest_tests.cpp"
  ;
  local_110 = "";
  pvVar2 = (iterator)0x2;
  psVar3 = &param;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[28]>
            (local_78,&local_118,0x19,1,2,psVar3,"param","/rest/endpoint/someresource",
             "\"/rest/endpoint/someresource\"");
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rest_tests.cpp"
  ;
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)psVar3;
  msg_02.m_begin = pvVar2;
  file_02.m_end = &DAT_0000001a;
  file_02.m_begin = (iterator)&local_128;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_138,
             msg_02);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rest_tests.cpp"
  ;
  local_140 = "";
  local_e4 = 1;
  pvVar2 = (iterator)0x2;
  pRVar4 = &rf;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,RESTResponseFormat,RESTResponseFormat>
            (local_78,&local_148,0x1a,1,2,pRVar4,"rf",(allocator<char> *)&local_e4,
             "RESTResponseFormat::BINARY");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"/rest/endpoint/someresource.hex?p1=v1&p2=v2",
             (allocator<char> *)&local_e4);
  rf = ParseDataFormat(&param,(string *)local_78);
  std::__cxx11::string::~string((string *)local_78);
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rest_tests.cpp"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)pRVar4;
  msg_03.m_begin = pvVar2;
  file_03.m_end = (iterator)0x1e;
  file_03.m_begin = (iterator)&local_158;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_168,
             msg_03);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rest_tests.cpp"
  ;
  local_170 = "";
  pvVar2 = (iterator)0x2;
  psVar3 = &param;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[28]>
            (local_78,&local_178,0x1e,1,2,psVar3,"param","/rest/endpoint/someresource",
             "\"/rest/endpoint/someresource\"");
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rest_tests.cpp"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)psVar3;
  msg_04.m_begin = pvVar2;
  file_04.m_end = (iterator)0x1f;
  file_04.m_begin = (iterator)&local_188;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_198,
             msg_04);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rest_tests.cpp"
  ;
  local_1a0 = "";
  local_e4 = 2;
  pvVar2 = (iterator)0x2;
  pRVar4 = &rf;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,RESTResponseFormat,RESTResponseFormat>
            (local_78,&local_1a8,0x1f,1,2,pRVar4,"rf",(allocator<char> *)&local_e4,
             "RESTResponseFormat::HEX");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"/rest/endpoint/someresource.json&p1=v1",
             (allocator<char> *)&local_e4);
  rf = ParseDataFormat(&param,(string *)local_78);
  std::__cxx11::string::~string((string *)local_78);
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rest_tests.cpp"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = (iterator)pRVar4;
  msg_05.m_begin = pvVar2;
  file_05.m_end = (iterator)0x23;
  file_05.m_begin = (iterator)&local_1b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1c8,
             msg_05);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rest_tests.cpp"
  ;
  local_1d0 = "";
  pvVar2 = (iterator)0x2;
  psVar3 = &param;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[39]>
            (local_78,&local_1d8,0x23,1,2,psVar3,"param","/rest/endpoint/someresource.json&p1=v1",
             "\"/rest/endpoint/someresource.json&p1=v1\"");
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rest_tests.cpp"
  ;
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = (iterator)psVar3;
  msg_06.m_begin = pvVar2;
  file_06.m_end = (iterator)0x24;
  file_06.m_begin = (iterator)&local_1e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_1f8,
             msg_06);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rest_tests.cpp"
  ;
  local_200 = "";
  local_e4 = 0;
  pvVar2 = (iterator)0x2;
  pRVar4 = &rf;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,RESTResponseFormat,RESTResponseFormat>
            (local_78,&local_208,0x24,1,2,pRVar4,"rf",(allocator<char> *)&local_e4,
             "RESTResponseFormat::UNDEF");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"/rest/endpoint/someresource?p1=v1",(allocator<char> *)&local_e4);
  rf = ParseDataFormat(&param,(string *)local_78);
  std::__cxx11::string::~string((string *)local_78);
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rest_tests.cpp"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = (iterator)pRVar4;
  msg_07.m_begin = pvVar2;
  file_07.m_end = &DAT_00000028;
  file_07.m_begin = (iterator)&local_218;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_228,
             msg_07);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rest_tests.cpp"
  ;
  local_230 = "";
  pvVar2 = (iterator)0x2;
  psVar3 = &param;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[28]>
            (local_78,&local_238,0x28,1,2,psVar3,"param","/rest/endpoint/someresource",
             "\"/rest/endpoint/someresource\"");
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rest_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = (iterator)psVar3;
  msg_08.m_begin = pvVar2;
  file_08.m_end = (iterator)0x29;
  file_08.m_begin = (iterator)&local_248;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_258,
             msg_08);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rest_tests.cpp"
  ;
  local_260 = "";
  local_e4 = 0;
  pvVar2 = (iterator)0x2;
  pRVar4 = &rf;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,RESTResponseFormat,RESTResponseFormat>
            (local_78,&local_268,0x29,1,2,pRVar4,"rf",(allocator<char> *)&local_e4,
             "RESTResponseFormat::UNDEF");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"/rest/endpoint/someresource?p1=v1.json",
             (allocator<char> *)&local_e4);
  rf = ParseDataFormat(&param,(string *)local_78);
  std::__cxx11::string::~string((string *)local_78);
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rest_tests.cpp"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = (iterator)pRVar4;
  msg_09.m_begin = pvVar2;
  file_09.m_end = (iterator)0x2d;
  file_09.m_begin = (iterator)&local_278;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_288,
             msg_09);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rest_tests.cpp"
  ;
  local_290 = "";
  pvVar2 = (iterator)0x2;
  psVar3 = &param;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[28]>
            (local_78,&local_298,0x2d,1,2,psVar3,"param","/rest/endpoint/someresource",
             "\"/rest/endpoint/someresource\"");
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rest_tests.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = (iterator)psVar3;
  msg_10.m_begin = pvVar2;
  file_10.m_end = (iterator)0x2e;
  file_10.m_begin = (iterator)&local_2a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_2b8,
             msg_10);
  local_78[8] = 0;
  local_78._0_8_ = &PTR__lazy_ostream_01139f30;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_78._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rest_tests.cpp"
  ;
  local_2c0 = "";
  local_e4 = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,RESTResponseFormat,RESTResponseFormat>
            (local_78,&local_2c8,0x2e,1,2,&rf,"rf",(allocator<char> *)&local_e4,
             "RESTResponseFormat::UNDEF");
  std::__cxx11::string::~string((string *)&param);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_query_string)
{
    std::string param;
    RESTResponseFormat rf;
    // No query string
    rf = ParseDataFormat(param, "/rest/endpoint/someresource.json");
    BOOST_CHECK_EQUAL(param, "/rest/endpoint/someresource");
    BOOST_CHECK_EQUAL(rf, RESTResponseFormat::JSON);

    // Query string with single parameter
    rf = ParseDataFormat(param, "/rest/endpoint/someresource.bin?p1=v1");
    BOOST_CHECK_EQUAL(param, "/rest/endpoint/someresource");
    BOOST_CHECK_EQUAL(rf, RESTResponseFormat::BINARY);

    // Query string with multiple parameters
    rf = ParseDataFormat(param, "/rest/endpoint/someresource.hex?p1=v1&p2=v2");
    BOOST_CHECK_EQUAL(param, "/rest/endpoint/someresource");
    BOOST_CHECK_EQUAL(rf, RESTResponseFormat::HEX);

    // Incorrectly formed query string will not be handled
    rf = ParseDataFormat(param, "/rest/endpoint/someresource.json&p1=v1");
    BOOST_CHECK_EQUAL(param, "/rest/endpoint/someresource.json&p1=v1");
    BOOST_CHECK_EQUAL(rf, RESTResponseFormat::UNDEF);

    // Omitted data format with query string should return UNDEF and hide query string
    rf = ParseDataFormat(param, "/rest/endpoint/someresource?p1=v1");
    BOOST_CHECK_EQUAL(param, "/rest/endpoint/someresource");
    BOOST_CHECK_EQUAL(rf, RESTResponseFormat::UNDEF);

    // Data format specified after query string
    rf = ParseDataFormat(param, "/rest/endpoint/someresource?p1=v1.json");
    BOOST_CHECK_EQUAL(param, "/rest/endpoint/someresource");
    BOOST_CHECK_EQUAL(rf, RESTResponseFormat::UNDEF);
}